

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1067.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  tree *this;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  tree *this_00;
  mapped_type *pptVar5;
  pointer ppVar6;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>
  local_c8;
  undefined1 local_b9;
  string local_b8 [32];
  tree *local_98;
  tree *new_tree;
  _Self local_88;
  iterator dir_tr;
  tree *ptStack_78;
  int j;
  tree *tr;
  string local_68 [8];
  string dir;
  string local_48 [8];
  string patch;
  int local_28;
  int i;
  tree *tr_root;
  int n;
  
  tr_root._4_4_ = 0;
  std::istream::operator>>((istream *)&std::cin,(int *)&tr_root);
  this = (tree *)operator_new(0x50);
  tree::tree(this);
  local_28 = 0;
  do {
    if ((int)tr_root <= local_28) {
      print_tr(this,0);
      return 0;
    }
    std::__cxx11::string::string(local_48);
    std::operator>>((istream *)&std::cin,local_48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"",(allocator *)((long)&tr + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&tr + 7));
    dir_tr._M_node._4_4_ = 0;
    ptStack_78 = this;
    while( true ) {
      uVar2 = (ulong)dir_tr._M_node._4_4_;
      uVar3 = std::__cxx11::string::size();
      if (uVar3 < uVar2) break;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
      if (*pcVar4 == '\\') {
LAB_00102599:
        local_88._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>_>
             ::find(&ptStack_78->child,(key_type *)local_68);
        new_tree = (tree *)std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>_>
                           ::end(&ptStack_78->child);
        bVar1 = std::operator==(&local_88,(_Self *)&new_tree);
        if (bVar1) {
          this_00 = (tree *)operator_new(0x50);
          local_b9 = 1;
          std::__cxx11::string::string(local_b8,local_68);
          tree::tree(this_00,(string *)local_b8);
          local_b9 = 0;
          std::__cxx11::string::~string(local_b8);
          local_98 = this_00;
          pptVar5 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>_>
                    ::operator[](&ptStack_78->child,(key_type *)local_68);
          *pptVar5 = this_00;
          local_c8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>_>
               ::find(&ptStack_78->child,(key_type *)local_68);
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>
                   ::operator->(&local_c8);
          ptStack_78 = ppVar6->second;
        }
        else {
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>
                   ::operator->(&local_88);
          ptStack_78 = ppVar6->second;
        }
        std::__cxx11::string::operator=(local_68,"");
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
        if (*pcVar4 == '\0') goto LAB_00102599;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
        std::__cxx11::string::operator+=(local_68,*pcVar4);
      }
      dir_tr._M_node._4_4_ = dir_tr._M_node._4_4_ + 1;
    }
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int main() {
    int n;
    std::cin >> n;

    tree *tr_root = new tree();

    for (int i = 0; i < n; ++i) {
        std::string patch;
        std::cin >> patch;
        std::string dir = "";

        tree *tr = tr_root;
        for (int j = 0; j <= patch.size(); ++j) {
            if (patch[j] == '\\' || patch[j] == '\0') {
                auto dir_tr = tr->child.find(dir);
                if (dir_tr == tr->child.end()){
                    tree *new_tree = new tree(dir);
                    tr->child[dir] = new_tree;
                    tr = tr->child.find(dir)->second;
                } else {
                    tr = dir_tr->second;
                }
                dir = "";
            } else {
                dir += patch[j];
            }
        }

    }
    print_tr(tr_root, 0);
    return 0;
}